

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Shop::updateMedicineDetails(Shop *this)

{
  ostream *poVar1;
  reference pvVar2;
  undefined1 local_a8 [8];
  Medicine medicine;
  int index;
  Shop *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "You need to Enter the Medicine id to Edit: So select medicine id from here"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  printMedicines(this);
  std::istream::operator>>((istream *)&std::cin,(int *)&medicine.field_0x8c);
  poVar1 = std::operator<<((ostream *)&std::cout,"Your selected Medicine is:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  printMedicine(this,medicine._140_4_ + -1);
  poVar1 = std::operator<<((ostream *)&std::cout,"What do you want to update? ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  pvVar2 = std::vector<Medicine,_std::allocator<Medicine>_>::operator[]
                     (&this->medicineList,(long)(medicine._140_4_ + -1));
  Medicine::Medicine((Medicine *)local_a8,pvVar2);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Updated Medicine Name:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,(string *)&medicine.quantity);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Updated Medicine Company Name:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,(string *)&medicine.field_0x28);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Updated Unit Price:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,(int *)(local_a8 + 4));
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Updated Arrival date:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,(string *)&medicine.field_0x48);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Updated Quantity date:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,&medicine.id);
  pvVar2 = std::vector<Medicine,_std::allocator<Medicine>_>::operator[]
                     (&this->medicineList,(long)(medicine._140_4_ + -1));
  Medicine::operator=(pvVar2,(Medicine *)local_a8);
  poVar1 = std::operator<<((ostream *)&std::cout,"Edited. New Medicine List is:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  printMedicines(this);
  Medicine::~Medicine((Medicine *)local_a8);
  return;
}

Assistant:

void updateMedicineDetails() {
        int index;
        cout << "You need to Enter the Medicine id to Edit: So select medicine id from here" << endl;
        printMedicines();
        cin >> index;
        cout << "Your selected Medicine is:" << endl;
        printMedicine(index - 1);
        cout << "What do you want to update? " << endl;

        Medicine medicine = medicineList[index - 1];

        cout << "Enter Updated Medicine Name:" << endl;
        cin >> medicine.name;
        cout << "Enter Updated Medicine Company Name:" << endl;
        cin >> medicine.companyName;
        cout << "Enter Updated Unit Price:" << endl;
        cin >> medicine.unitePrice;
        cout << "Enter Updated Arrival date:" << endl;
        cin >> medicine.arrivalDate;
        /* cout<<"Enter Updated Expire date:"<<endl;
         cin>>medicine.expireDate;*/
        cout << "Enter Updated Quantity date:" << endl;
        cin >> medicine.quantity;

        medicineList[index - 1] = medicine;

        cout << "Edited. New Medicine List is:" << endl;
        printMedicines();
    }